

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

Vec_Ptr_t * Vec_PtrAllocTruthTables(int nVars)

{
  void *pvVar1;
  void **ppvVar2;
  ulong uVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar9 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar9 = 1;
  }
  ppvVar2 = (void **)malloc(((long)(int)uVar9 * 4 + 8) * (long)nVars);
  uVar3 = 0;
  uVar8 = 0;
  if (0 < nVars) {
    uVar8 = (ulong)(uint)nVars;
  }
  lVar7 = (long)nVars << 3;
  for (; uVar8 != uVar3; uVar3 = uVar3 + 1) {
    ppvVar2[uVar3] = (void *)((long)ppvVar2 + lVar7);
    lVar7 = lVar7 + (long)(int)uVar9 * 4;
  }
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nSize = nVars;
  pVVar4->nCap = nVars;
  pVVar4->pArray = ppvVar2;
  uVar6 = 0;
  uVar3 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar3 = uVar6;
  }
  for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
    pvVar1 = ppvVar2[uVar6];
    if (uVar6 < 5) {
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        *(undefined4 *)((long)pvVar1 + uVar5 * 4) = (&DAT_0080c4b0)[uVar6];
      }
    }
    else {
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        *(uint *)((long)pvVar1 + uVar5 * 4) =
             -(uint)((1 << ((char)uVar6 - 5U & 0x1f) & (uint)uVar5) != 0);
      }
    }
  }
  return pVVar4;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrAllocTruthTables( int nVars )
{
    Vec_Ptr_t * p;
    unsigned Masks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned * pTruth;
    int i, k, nWords;
    nWords = (nVars <= 5 ? 1 : (1 << (nVars - 5)));
    p = Vec_PtrAllocSimInfo( nVars, nWords );
    for ( i = 0; i < nVars; i++ )
    {
        pTruth = (unsigned *)p->pArray[i];
        if ( i < 5 )
        {
            for ( k = 0; k < nWords; k++ )
                pTruth[k] = Masks[i];
        }
        else
        {
            for ( k = 0; k < nWords; k++ )
                if ( k & (1 << (i-5)) )
                    pTruth[k] = ~(unsigned)0;
                else
                    pTruth[k] = 0;
        }
    }
    return p;
}